

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O2

uint64_t __thiscall
XPMP2::SoundSystemFMOD::Play(SoundSystemFMOD *this,string *sndName,float vol,Aircraft *ac)

{
  FMOD_RESULT FVar1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  SoundFile *pSVar5;
  uint64_t uVar6;
  runtime_error *prVar7;
  FmodError *pFVar8;
  pair<unsigned_long,_XPMP2::SoundChannel_*> pVar9;
  allocator<char> local_10b;
  allocator<char> local_10a;
  allocator<char> local_109;
  FMOD_CHANNEL *pFmodChn;
  string local_100;
  string local_e0;
  float local_bc;
  string local_b8;
  FmodError local_98;
  string *local_38;
  
  pFmodChn = (FMOD_CHANNEL *)0x0;
  local_bc = vol;
  local_38 = sndName;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>_>
           ::at(&(this->super_SoundSystem).mapSounds,sndName);
  iVar3 = (*((pmVar4->_M_t).
             super___uniq_ptr_impl<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>._M_t.
             super__Tuple_impl<0UL,_XPMP2::SoundFile_*,_std::default_delete<XPMP2::SoundFile>_>.
             super__Head_base<0UL,_XPMP2::SoundFile_*,_false>._M_head_impl)->_vptr_SoundFile[2])();
  if ((char)iVar3 == '\0') {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"Sound not yet ready");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pSVar5 = (pmVar4->_M_t).
           super___uniq_ptr_impl<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>._M_t.
           super__Tuple_impl<0UL,_XPMP2::SoundFile_*,_std::default_delete<XPMP2::SoundFile>_>.
           super__Head_base<0UL,_XPMP2::SoundFile_*,_false>._M_head_impl;
  if (pSVar5 != (SoundFile *)0x0) {
    pSVar5 = (SoundFile *)__dynamic_cast(pSVar5,&SoundFile::typeinfo,&SoundFMOD::typeinfo,0);
    if (pSVar5 != (SoundFile *)0x0) {
      gFmodRes = FMOD_System_PlaySound
                           (this->pFmodSystem,pSVar5[1]._vptr_SoundFile,this->pChnGrp,1,&pFmodChn);
      if (gFmodRes != FMOD_OK) {
        pFVar8 = (FmodError *)__cxa_allocate_exception(0x60);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,
                   "FMOD_System_PlaySound(pFmodSystem, pSndFmod->GetSnd(), pChnGrp, true, &pFmodChn)"
                   ,(allocator<char> *)&local_b8);
        FVar1 = gFmodRes;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                   ,&local_10a);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"Play",&local_10b);
        FmodError::FmodError(pFVar8,(string *)&local_98,FVar1,&local_e0,0x126,&local_100);
        __cxa_throw(pFVar8,&FmodError::typeinfo,FmodError::~FmodError);
      }
      if (pFmodChn != (FMOD_CHANNEL *)0x0) {
        pVar9 = SoundSystem::AddChn(&this->super_SoundSystem,pSVar5,local_bc,pFmodChn);
        uVar6 = pVar9.first;
        if (pVar9.second == (SoundChannel *)0x0) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar7,"pChn is NULL");
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        gFmodRes = FMOD_Channel_SetUserData(pFmodChn,uVar6);
        if (gFmodRes == FMOD_OK) {
          gFmodRes = FMOD_Channel_SetCallback(pFmodChn,ChnCB);
          if (gFmodRes == FMOD_OK) {
            gFmodRes = FMOD_Channel_Set3DMinMaxDistance((float)ac->sndMinDist,0x461c4000,pFmodChn);
            if (gFmodRes != FMOD_OK) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_e0,
                         "FMOD_Channel_Set3DMinMaxDistance(pFmodChn, (float)ac.sndMinDist, FMOD_3D_MAX_DIST)"
                         ,&local_10a);
              FVar1 = gFmodRes;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_100,
                         "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                         ,&local_10b);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_b8,"Play",&local_109);
              FmodError::FmodError(&local_98,&local_e0,FVar1,&local_100,0x131,&local_b8);
              FmodError::LogErr(&local_98);
              FmodError::~FmodError(&local_98);
              std::__cxx11::string::~string((string *)&local_b8);
              std::__cxx11::string::~string((string *)&local_100);
              std::__cxx11::string::~string((string *)&local_e0);
            }
            bVar2 = SoundFile::hasConeInfo(pSVar5);
            if (bVar2) {
              gFmodRes = FMOD_Channel_Set3DConeSettings
                                   (pSVar5->coneInAngle,pSVar5->coneOutAngle,pSVar5->coneOutVol,
                                    pFmodChn);
              if (gFmodRes != FMOD_OK) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_e0,
                           "FMOD_Channel_Set3DConeSettings(pFmodChn, pSndFmod->coneInAngle, pSndFmod->coneOutAngle, pSndFmod->coneOutVol)"
                           ,&local_10a);
                FVar1 = gFmodRes;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_100,
                           "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                           ,&local_10b);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_b8,"Play",&local_109);
                FmodError::FmodError(&local_98,&local_e0,FVar1,&local_100,0x136,&local_b8);
                FmodError::LogErr(&local_98);
                FmodError::~FmodError(&local_98);
                std::__cxx11::string::~string((string *)&local_b8);
                std::__cxx11::string::~string((string *)&local_100);
                std::__cxx11::string::~string((string *)&local_e0);
              }
            }
            (*(this->super_SoundSystem)._vptr_SoundSystem[6])(this,uVar6,ac,1);
            gFmodRes = FMOD_Channel_SetVolume(local_bc,pFmodChn);
            if (gFmodRes != FMOD_OK) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_e0,"FMOD_Channel_SetVolume(pFmodChn, vol)",&local_10a);
              FVar1 = gFmodRes;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_100,
                         "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                         ,&local_10b);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_b8,"Play",&local_109);
              FmodError::FmodError(&local_98,&local_e0,FVar1,&local_100,0x139,&local_b8);
              FmodError::LogErr(&local_98);
              FmodError::~FmodError(&local_98);
              std::__cxx11::string::~string((string *)&local_b8);
              std::__cxx11::string::~string((string *)&local_100);
              std::__cxx11::string::~string((string *)&local_e0);
            }
            gFmodRes = FMOD_Channel_SetMute(pFmodChn,ac->bChnMuted);
            if (gFmodRes != FMOD_OK) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_e0,"FMOD_Channel_SetMute(pFmodChn, ac.SoundIsMuted())",
                         &local_10a);
              FVar1 = gFmodRes;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_100,
                         "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                         ,&local_10b);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_b8,"Play",&local_109);
              FmodError::FmodError(&local_98,&local_e0,FVar1,&local_100,0x13a,&local_b8);
              FmodError::LogErr(&local_98);
              FmodError::~FmodError(&local_98);
              std::__cxx11::string::~string((string *)&local_b8);
              std::__cxx11::string::~string((string *)&local_100);
              std::__cxx11::string::~string((string *)&local_e0);
            }
            if (this->bLowPass == true) {
              gFmodRes = FMOD_Channel_SetLowPassGain(0x3e4ccccd,pFmodChn);
              if (gFmodRes != FMOD_OK) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_e0,
                           "FMOD_Channel_SetLowPassGain(pFmodChn, FMOD_LOW_PASS_GAIN)",&local_10a);
                FVar1 = gFmodRes;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_100,
                           "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                           ,&local_10b);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_b8,"Play",&local_109);
                FmodError::FmodError(&local_98,&local_e0,FVar1,&local_100,0x13c,&local_b8);
                FmodError::LogErr(&local_98);
                FmodError::~FmodError(&local_98);
                std::__cxx11::string::~string((string *)&local_b8);
                std::__cxx11::string::~string((string *)&local_100);
                std::__cxx11::string::~string((string *)&local_e0);
              }
            }
            return uVar6;
          }
          pFVar8 = (FmodError *)__cxa_allocate_exception(0x60);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"FMOD_Channel_SetCallback(pFmodChn, ChnCB)",
                     (allocator<char> *)&local_b8);
          FVar1 = gFmodRes;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e0,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                     ,&local_10a);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"Play",&local_10b)
          ;
          FmodError::FmodError(pFVar8,(string *)&local_98,FVar1,&local_e0,0x12e,&local_100);
          __cxa_throw(pFVar8,&FmodError::typeinfo,FmodError::~FmodError);
        }
        pFVar8 = (FmodError *)__cxa_allocate_exception(0x60);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"FMOD_Channel_SetUserData(pFmodChn, (void*)sndId)",
                   (allocator<char> *)&local_b8);
        FVar1 = gFmodRes;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                   ,&local_10a);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"Play",&local_10b);
        FmodError::FmodError(pFVar8,(string *)&local_98,FVar1,&local_e0,0x12d,&local_100);
        __cxa_throw(pFVar8,&FmodError::typeinfo,FmodError::~FmodError);
      }
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"FMOD_System_PlaySound returned NULL channel");
      goto LAB_0020d58c;
    }
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"Sound has not been loaded for FMOD system");
LAB_0020d58c:
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint64_t SoundSystemFMOD::Play (const std::string& sndName, float vol, const Aircraft& ac)
{
    FMOD_CHANNEL* pFmodChn = nullptr;
    uint64_t sndId = 0;

    // Find the sound a check if it is ready
    try {
        // find the sound, may throw if not found, return if sound isn't ready yet
        SoundFilePtr& pSnd = mapSounds.at(sndName);
        if (!pSnd->isReady()) throw std::runtime_error("Sound not yet ready");
        SoundFMOD* pSndFmod = dynamic_cast<SoundFMOD*>(pSnd.get());
        if (!pSndFmod) throw std::runtime_error("Sound has not been loaded for FMOD system");

        // Start playing the sound, but in a paused state to avoid crackling
        FMOD_TEST(FMOD_System_PlaySound(pFmodSystem, pSndFmod->GetSnd(), pChnGrp, true, &pFmodChn));
        if (!pFmodChn) throw std::runtime_error("FMOD_System_PlaySound returned NULL channel");
        
        // We must keep track of the sounds we produce so we can clean up after us
        SoundChannel* pChn = nullptr;
        std::tie(sndId, pChn) = AddChn(pSndFmod, vol, pFmodChn);
        if (!pChn) throw std::runtime_error("pChn is NULL");
        FMOD_TEST(FMOD_Channel_SetUserData(pFmodChn, (void*)sndId));// save internal sound id for later bookkeeping
        FMOD_TEST(FMOD_Channel_SetCallback(pFmodChn, ChnCB));       // set callback, this is essential for internal cleanup!
        
        // Set a few more parameters to the sound
        FMOD_LOG(FMOD_Channel_Set3DMinMaxDistance(pFmodChn, (float)ac.sndMinDist, FMOD_3D_MAX_DIST));
        if (pSndFmod->hasConeInfo()) {
            FMOD_LOG(FMOD_Channel_Set3DConeSettings(pFmodChn,
                                                    pSndFmod->coneInAngle,
                                                    pSndFmod->coneOutAngle,
                                                    pSndFmod->coneOutVol));
        }
        SetPosOrientation(sndId, ac, true);
        FMOD_LOG(FMOD_Channel_SetVolume(pFmodChn, vol));
        FMOD_LOG(FMOD_Channel_SetMute(pFmodChn, ac.SoundIsMuted()));
        if (bLowPass) {
            FMOD_LOG(FMOD_Channel_SetLowPassGain(pFmodChn, FMOD_LOW_PASS_GAIN));
        }

        // Success
        return sndId;
    }
    FMOD_CATCH
    catch (const std::runtime_error& e) {
        LOG_MSG(logERR, "Could not play sound '%s': %s",
                sndName.c_str(), e.what());
    }
    
    // So there was an error...we better remove the sound
    if (sndId)
        RemoveChn(sndId);
    
    return 0;
}